

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O0

void __thiscall
soul::SanityCheckPass::PostResolutionChecks::visit(soul::AST::Graph&)::CycleDetector::
CycleDetector(soul::AST::Graph__(void *this,Graph *graph)

{
  bool bVar1;
  size_type numNodes;
  pool_ref *ppVar2;
  Connection *pCVar3;
  ProcessorInstance *pPVar4;
  ProcessorInstance *dest;
  undefined1 local_78 [8];
  pool_ptr<soul::AST::ProcessorInstance> dst;
  pool_ptr<soul::AST::ProcessorInstance> src;
  pool_ref<soul::AST::Connection> *c;
  iterator __end3_1;
  iterator __begin3_1;
  vector<soul::pool_ref<soul::AST::Connection>,_std::allocator<soul::pool_ref<soul::AST::Connection>_>_>
  *__range3_1;
  pool_ref<soul::AST::ProcessorInstance> *p;
  iterator __end3;
  iterator __begin3;
  vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
  *__range3;
  Graph *graph_local;
  CycleDetector *this_local;
  
  heart::Utilities::
  GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>
  ::GraphTraversalHelper
            ((GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>
              *)this);
  numNodes = std::
             vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
             ::size(&graph->processorInstances);
  heart::Utilities::
  GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>
  ::reserve((GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>
             *)this,numNodes);
  __end3 = std::
           vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
           ::begin(&graph->processorInstances);
  p = (pool_ref<soul::AST::ProcessorInstance> *)
      std::
      vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
      ::end(&graph->processorInstances);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end3,(__normal_iterator<soul::pool_ref<soul::AST::ProcessorInstance>_*,_std::vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>_>
                                     *)&p), bVar1) {
    ppVar2 = (pool_ref *)
             __gnu_cxx::
             __normal_iterator<soul::pool_ref<soul::AST::ProcessorInstance>_*,_std::vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>_>
             ::operator*(&__end3);
    pPVar4 = pool_ref::operator_cast_to_ProcessorInstance_(ppVar2);
    heart::Utilities::
    GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>
    ::addNode((GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>
               *)this,pPVar4);
    __gnu_cxx::
    __normal_iterator<soul::pool_ref<soul::AST::ProcessorInstance>_*,_std::vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>_>
    ::operator++(&__end3);
  }
  __end3_1 = std::
             vector<soul::pool_ref<soul::AST::Connection>,_std::allocator<soul::pool_ref<soul::AST::Connection>_>_>
             ::begin(&graph->connections);
  c = (pool_ref<soul::AST::Connection> *)
      std::
      vector<soul::pool_ref<soul::AST::Connection>,_std::allocator<soul::pool_ref<soul::AST::Connection>_>_>
      ::end(&graph->connections);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end3_1,
                            (__normal_iterator<soul::pool_ref<soul::AST::Connection>_*,_std::vector<soul::pool_ref<soul::AST::Connection>,_std::allocator<soul::pool_ref<soul::AST::Connection>_>_>_>
                             *)&c), bVar1) {
    ppVar2 = (pool_ref *)
             __gnu_cxx::
             __normal_iterator<soul::pool_ref<soul::AST::Connection>_*,_std::vector<soul::pool_ref<soul::AST::Connection>,_std::allocator<soul::pool_ref<soul::AST::Connection>_>_>_>
             ::operator*(&__end3_1);
    pCVar3 = pool_ref<soul::AST::Connection>::operator->((pool_ref<soul::AST::Connection> *)ppVar2);
    bVar1 = pool_ptr<soul::AST::Expression>::operator==(&pCVar3->delayLength,(void *)0x0);
    if (bVar1) {
      pool_ref<soul::AST::Connection>::operator->((pool_ref<soul::AST::Connection> *)ppVar2);
      soul::AST::Connection::getSourceProcessor((Connection *)&dst);
      bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&dst);
      if (bVar1) {
        pool_ref<soul::AST::Connection>::operator->((pool_ref<soul::AST::Connection> *)ppVar2);
        soul::AST::Connection::getDestProcessor((Connection *)local_78);
        bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)local_78);
        if (bVar1) {
          pPVar4 = pool_ptr<soul::AST::ProcessorInstance>::operator*(&dst);
          dest = pool_ptr<soul::AST::ProcessorInstance>::operator*
                           ((pool_ptr<soul::AST::ProcessorInstance> *)local_78);
          pCVar3 = pool_ref::operator_cast_to_Connection_(ppVar2);
          heart::Utilities::
          GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>
          ::addConnection((GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>
                           *)this,pPVar4,dest,pCVar3);
        }
        pool_ptr<soul::AST::ProcessorInstance>::~pool_ptr
                  ((pool_ptr<soul::AST::ProcessorInstance> *)local_78);
      }
      pool_ptr<soul::AST::ProcessorInstance>::~pool_ptr(&dst);
    }
    __gnu_cxx::
    __normal_iterator<soul::pool_ref<soul::AST::Connection>_*,_std::vector<soul::pool_ref<soul::AST::Connection>,_std::allocator<soul::pool_ref<soul::AST::Connection>_>_>_>
    ::operator++(&__end3_1);
  }
  return;
}

Assistant:

CycleDetector (AST::Graph& graph)
                {
                    reserve (graph.processorInstances.size());

                    for (auto& p : graph.processorInstances)
                        addNode (p);

                    for (auto& c : graph.connections)
                        if (c->delayLength == nullptr)
                            if (auto src = c->getSourceProcessor())
                                if (auto dst = c->getDestProcessor())
                                    addConnection (*src, *dst, c);
                }